

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

void __thiscall
skiplist<int,_std::less<int>_>::_setup_random_number_generator(skiplist<int,_std::less<int>_> *this)

{
  result_type_conflict1 rVar1;
  undefined1 local_1d80 [8];
  uniform_real_distribution<double> dist;
  undefined1 local_1d60 [8];
  mt19937_64 mt;
  random_device rd;
  skiplist<int,_std::less<int>_> *this_local;
  
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar1 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_1d60,(ulong)rVar1);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_1d80,0.0,1.0);
  memcpy(&this->mt_,local_1d60,0x9c8);
  (this->dist_)._M_param._M_a = (double)local_1d80;
  (this->dist_)._M_param._M_b = dist._M_param._M_a;
  std::random_device::~random_device((random_device *)&mt._M_p);
  return;
}

Assistant:

void _setup_random_number_generator() {
        // set up random number generator
        // ref: https://stackoverflow.com/a/19666713/11199009
        std::random_device rd;
        // ref: https://www.cplusplus.com/reference/random/mt19937_64/
        std::mt19937_64 mt(rd());
        // usage of this is: dist(mt)
        std::uniform_real_distribution<double> dist(0.0, 1.0);

        this->mt_ = mt;
        this->dist_ = dist;
    }